

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O3

void __thiscall deqp::egl::MakeCurrentPerfCase::createSurfaces(MakeCurrentPerfCase *this)

{
  SurfaceType SVar1;
  ulong uVar2;
  vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
  types;
  SurfaceType local_2c;
  vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
  local_28;
  
  local_28.
  super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (SurfaceType *)0x0;
  local_28.
  super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (SurfaceType *)0x0;
  SVar1 = (this->m_spec).surfaceTypes;
  if ((SVar1 & SURFACETYPE_WINDOW) != 0) {
    local_2c = SURFACETYPE_WINDOW;
    std::
    vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
    ::_M_realloc_insert<deqp::egl::MakeCurrentPerfCase::SurfaceType>
              (&local_28,(iterator)0x0,&local_2c);
    SVar1 = (this->m_spec).surfaceTypes;
  }
  if ((SVar1 & SURFACETYPE_PIXMAP) != 0) {
    local_2c = SURFACETYPE_PIXMAP;
    if (local_28.
        super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_28.
        super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
      ::_M_realloc_insert<deqp::egl::MakeCurrentPerfCase::SurfaceType>
                (&local_28,
                 (iterator)
                 local_28.
                 super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_2c);
    }
    else {
      *local_28.
       super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
       ._M_impl.super__Vector_impl_data._M_finish = SURFACETYPE_PIXMAP;
      local_28.
      super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_28.
           super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    SVar1 = (this->m_spec).surfaceTypes;
  }
  if ((SVar1 & SURFACETYPE_PBUFFER) != 0) {
    local_2c = SURFACETYPE_PBUFFER;
    if (local_28.
        super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_28.
        super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
      ::_M_realloc_insert<deqp::egl::MakeCurrentPerfCase::SurfaceType>
                (&local_28,
                 (iterator)
                 local_28.
                 super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_2c);
    }
    else {
      *local_28.
       super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
       ._M_impl.super__Vector_impl_data._M_finish = SURFACETYPE_PBUFFER;
      local_28.
      super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_28.
           super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (0 < (this->m_spec).surfaceCount) {
    uVar2 = 0;
    do {
      SVar1 = local_28.
              super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
              ._M_impl.super__Vector_impl_data._M_start
              [uVar2 % (ulong)((long)local_28.
                                     super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_28.
                                     super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2)];
      if (SVar1 == SURFACETYPE_PIXMAP) {
        createPixmap(this);
      }
      else if (SVar1 == SURFACETYPE_WINDOW) {
        createWindow(this);
      }
      else if (SVar1 == SURFACETYPE_PBUFFER) {
        createPBuffer(this);
      }
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)(this->m_spec).surfaceCount);
  }
  if (local_28.
      super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MakeCurrentPerfCase::createSurfaces (void)
{
	vector<SurfaceType> types;

	if ((m_spec.surfaceTypes & SURFACETYPE_WINDOW) != 0)
		types.push_back(SURFACETYPE_WINDOW);

	if ((m_spec.surfaceTypes & SURFACETYPE_PIXMAP) != 0)
		types.push_back(SURFACETYPE_PIXMAP);

	if ((m_spec.surfaceTypes & SURFACETYPE_PBUFFER) != 0)
		types.push_back(SURFACETYPE_PBUFFER);

	DE_ASSERT((int)types.size() <= m_spec.surfaceCount);

	// Create surfaces
	for (int surfaceNdx = 0; surfaceNdx < m_spec.surfaceCount; surfaceNdx++)
	{
		SurfaceType type = types[surfaceNdx % types.size()];

		switch (type)
		{
			case SURFACETYPE_PBUFFER:
				createPBuffer();
				break;

			case SURFACETYPE_WINDOW:
				createWindow();
				break;

			case SURFACETYPE_PIXMAP:
				createPixmap();
				break;

			default:
				DE_ASSERT(false);
		};
	}
}